

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O2

void __thiscall axl::io::MappedFile::attach(MappedFile *this,Handle fileHandle,uint_t flags)

{
  Handle __fd;
  
  __fd = fileHandle;
  close(this,fileHandle);
  sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::close
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)this,__fd);
  (this->m_file).m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       fileHandle;
  this->m_fileFlags = flags;
  return;
}

Assistant:

void
MappedFile::attach(
	File::Handle fileHandle,
	uint_t flags
) {
	close();

	m_file.m_file.attach(fileHandle);
	m_fileFlags = flags;
}